

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

bool __thiscall c4::yml::Tree::has_sibling(Tree *this,size_t node,size_t sib)

{
  size_t sVar1;
  code *pcVar2;
  bool bVar3;
  undefined1 uVar4;
  
  if ((node == 0xffffffffffffffff) || (this->m_cap <= node)) {
    if ((s_error_flags & 1) != 0) {
      bVar3 = is_debugger_attached();
      if (bVar3) {
        pcVar2 = (code *)swi(3);
        uVar4 = (*pcVar2)();
        return (bool)uVar4;
      }
    }
    (*(code *)PTR_error_impl_00240518)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  sVar1 = this->m_buf[node].m_parent;
  if ((sib == 0xffffffffffffffff) || (this->m_cap <= sib)) {
    if ((s_error_flags & 1) != 0) {
      bVar3 = is_debugger_attached();
      if (bVar3) {
        pcVar2 = (code *)swi(3);
        uVar4 = (*pcVar2)();
        return (bool)uVar4;
      }
    }
    (*(code *)PTR_error_impl_00240518)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  return sVar1 == this->m_buf[sib].m_parent;
}

Assistant:

bool has_sibling(size_t node, size_t sib) const { return _p(node)->m_parent == _p(sib)->m_parent; }